

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool run_container_is_subset_bitset(run_container_t *container1,bitset_container_t *container2)

{
  uint uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  bool bVar13;
  
  iVar5 = container2->cardinality;
  if (iVar5 == -1) {
    iVar5 = bitset_container_compute_cardinality(container2);
    lVar6 = cpuid_Extended_Feature_Enumeration_info(7);
    if ((*(uint *)(lVar6 + 4) & 0x20) == 0) {
      iVar4 = container1->n_runs;
      lVar6 = (long)iVar4;
      if (0 < lVar6) {
        lVar8 = 0;
        do {
          iVar4 = iVar4 + (uint)container1->runs[lVar8].length;
          lVar8 = lVar8 + 1;
        } while (lVar6 != lVar8);
      }
      goto LAB_0010ed12;
    }
  }
  else {
    lVar6 = cpuid_Extended_Feature_Enumeration_info(7);
    if ((*(uint *)(lVar6 + 4) & 0x20) == 0) {
      iVar4 = container1->n_runs;
      lVar6 = (long)iVar4;
      if (0 < lVar6) {
        lVar8 = 0;
        do {
          iVar4 = iVar4 + (uint)container1->runs[lVar8].length;
          lVar8 = lVar8 + 1;
        } while (lVar6 != lVar8);
      }
      goto LAB_0010ed12;
    }
  }
  iVar4 = _avx2_run_container_cardinality(container1);
LAB_0010ed12:
  if (iVar5 < iVar4) {
    bVar13 = false;
  }
  else {
    uVar7 = (ulong)container1->n_runs;
    bVar13 = (long)uVar7 < 1;
    if (0 < (long)uVar7) {
      uVar9 = 0;
      do {
        uVar2 = container1->runs[uVar9].value;
        if ((container2->words[uVar2 >> 6] >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
          return bVar13;
        }
        uVar3 = container1->runs[uVar9].length;
        uVar11 = (uint)uVar3;
        uVar10 = uVar2 - 1;
        do {
          bVar12 = uVar11 == 0;
          uVar11 = uVar11 - 1;
          if (bVar12) goto LAB_0010ed7a;
          uVar1 = uVar10 + 2;
          uVar10 = uVar10 + 1;
        } while ((*(ulong *)((long)container2->words + (ulong)(uVar1 >> 3 & 0x1ff8)) >>
                  ((ulong)uVar1 & 0x3f) & 1) != 0);
        if (uVar10 < (uint)uVar3 + (uint)uVar2) {
          return bVar13;
        }
LAB_0010ed7a:
        uVar9 = uVar9 + 1;
        bVar13 = uVar7 <= uVar9;
      } while (uVar9 != uVar7);
    }
  }
  return bVar13;
}

Assistant:

bool run_container_is_subset_bitset(const run_container_t* container1,
                                    const bitset_container_t* container2) {
    // todo: this code could be much faster
    if (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) {
        if (container2->cardinality < run_container_cardinality(container1)) {
            return false;
        }
    } else {
        int32_t card = bitset_container_compute_cardinality(
            container2);  // modify container2?
        if (card < run_container_cardinality(container1)) {
            return false;
        }
    }
    for (int i = 0; i < container1->n_runs; ++i) {
        uint32_t run_start = container1->runs[i].value;
        uint32_t le = container1->runs[i].length;
        for (uint32_t j = run_start; j <= run_start + le; ++j) {
            if (!bitset_container_contains(container2, j)) {
                return false;
            }
        }
    }
    return true;
}